

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_EntityIdentifier.h
# Opt level: O3

void __thiscall KDIS::PDU::LE_Header::SetLiveEntityID(LE_Header *this,LE_EntityIdentifier *ID)

{
  KUINT8 KVar1;
  KUINT16 KVar2;
  
  KVar1 = ID->m_ui8ApplicationID;
  KVar2 = ID->m_ui16EntityID;
  (this->m_EntID).m_ui8SiteID = ID->m_ui8SiteID;
  (this->m_EntID).m_ui8ApplicationID = KVar1;
  (this->m_EntID).m_ui16EntityID = KVar2;
  return;
}

Assistant:

class KDIS_EXPORT LE_EntityIdentifier : public DataTypeBase
{
protected:

    KUINT8 m_ui8SiteID;

    KUINT8 m_ui8ApplicationID;

    KUINT16 m_ui16EntityID;

public:

    static const KUINT16 LE_ENTITY_IDENTIFER_SIZE = 4;

    LE_EntityIdentifier();

    LE_EntityIdentifier( KUINT8 SiteID, KUINT8 ApplicatonID, KUINT16 EntityID );

    LE_EntityIdentifier(KDataStream &stream) noexcept(false);

    virtual ~LE_EntityIdentifier();

    //************************************
    // FullName:    KDIS::DATA_TYPE::LE_EntityIdentifier::SetSiteID
    //              KDIS::DATA_TYPE::LE_EntityIdentifier::GetSiteID
    // Description: Site ID for Live Entity EntityIdentifier's.
    // Parameter:   KUINT8 ID
    //************************************
    void SetSiteID( KUINT8 ID );
    KUINT8 GetSiteID() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::LE_EntityIdentifier::SetApplicationID
    //              KDIS::DATA_TYPE::LE_EntityIdentifier::GetApplicationID
    // Description: Application ID for Live Entity EntityIdentifier's.
    // Parameter:   KUINT8 ID
    //************************************
    void SetApplicationID( KUINT8 ID );
    KUINT8 GetApplicationID() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::LE_EntityIdentifier::SetEntityID
    //              KDIS::DATA_TYPE::LE_EntityIdentifier::GetEntityID
    // Description: Entity ID, also known as Object ID, Process Numbers and
    //              Reference Number in DIS version 7.
    // Parameter:   KUINT16 ID
    //************************************
    void SetEntityID( KUINT16 ID );
    KUINT16 GetEntityID() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::LE_EntityIdentifier::GetAsString
    // Description: Returns a string representation
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::LE_EntityIdentifier::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual void Decode(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::LE_EntityIdentifier::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const LE_EntityIdentifier & Value ) const;
    KBOOL operator != ( const LE_EntityIdentifier & Value ) const;
    KBOOL operator <  ( const LE_EntityIdentifier & Value ) const;
}